

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void mspace_malloc_stats(mspace msp)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (*(ulong *)((long)msp + 0x28) == 0) {
    uVar4 = 0;
    lVar9 = 0;
    lVar5 = 0;
  }
  else {
    uVar4 = *(undefined8 *)((long)msp + 0x360);
    lVar9 = *(long *)((long)msp + 0x358);
    lVar5 = (lVar9 - *(long *)((long)msp + 0x10)) + -0x50;
    for (puVar3 = (ulong *)((long)msp + 0x378); puVar3 != (ulong *)0x0; puVar3 = (ulong *)puVar3[2])
    {
      uVar1 = *puVar3;
      uVar6 = (int)uVar1 + 0x10;
      uVar7 = (ulong)(-uVar6 & 0xf);
      if ((uVar6 & 0xf) == 0) {
        uVar7 = 0;
      }
      for (uVar7 = uVar7 + uVar1;
          (((uVar1 <= uVar7 && (uVar7 != *(ulong *)((long)msp + 0x28))) &&
           (uVar7 < puVar3[1] + uVar1)) && (uVar2 = *(ulong *)(uVar7 + 8), uVar2 != 0xb));
          uVar7 = uVar7 + (uVar2 & 0xfffffffffffffff8)) {
        uVar8 = 0;
        if (((uint)uVar2 & 3) == 1) {
          uVar8 = uVar2 & 0xfffffffffffffff8;
        }
        lVar5 = lVar5 - uVar8;
      }
    }
  }
  fprintf(_stderr,"max system bytes = %10lu\n",uVar4);
  fprintf(_stderr,"system bytes     = %10lu\n",lVar9);
  fprintf(_stderr,"in use bytes     = %10lu\n",lVar5);
  return;
}

Assistant:

void mspace_malloc_stats(mspace msp) {
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    internal_malloc_stats(ms);
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
}